

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

void Sbl_ManGetCurrentMapping(Sbl_Man_t *p)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  undefined1 auVar7 [16];
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  auVar7 = _DAT_008403e0;
  pVVar2 = p->vWindow;
  iVar1 = pVVar2->nSize;
  if (0 < (long)iVar1) {
    pVVar8 = pVVar2->pArray;
    lVar10 = (long)iVar1 + -1;
    auVar14._8_4_ = (int)lVar10;
    auVar14._0_8_ = lVar10;
    auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar14 = auVar14 ^ _DAT_008403e0;
    auVar16 = _DAT_008403c0;
    auVar17 = _DAT_008403d0;
    do {
      auVar18 = auVar17 ^ auVar7;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar15 && auVar14._0_4_ < auVar18._0_4_ ||
                  iVar15 < auVar18._4_4_) & 1)) {
        *(undefined4 *)((long)&pVVar8->nSize + lVar10) = 0;
      }
      if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
          auVar18._12_4_ <= auVar14._12_4_) {
        *(undefined4 *)((long)&pVVar8[1].nSize + lVar10) = 0;
      }
      auVar18 = auVar16 ^ auVar7;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar15 && (iVar19 != iVar15 || auVar18._0_4_ <= auVar14._0_4_)) {
        *(undefined4 *)((long)&pVVar8[2].nSize + lVar10) = 0;
        *(undefined4 *)((long)&pVVar8[3].nSize + lVar10) = 0;
      }
      lVar9 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar9 + 4;
      lVar9 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar9 + 4;
      lVar10 = lVar10 + 0x40;
    } while ((ulong)(iVar1 + 3U >> 2) << 6 != lVar10);
  }
  pVVar2->nSize = 0;
  iVar1 = p->vAnds->nSize;
  iVar15 = pVVar2->nCap;
  if (iVar15 < iVar1) {
    if (pVVar2->pArray == (Vec_Int_t *)0x0) {
      pVVar8 = (Vec_Int_t *)malloc((long)iVar1 << 4);
    }
    else {
      pVVar8 = (Vec_Int_t *)realloc(pVVar2->pArray,(long)iVar1 << 4);
      iVar15 = pVVar2->nCap;
    }
    pVVar2->pArray = pVVar8;
    memset(pVVar8 + iVar15,0,(long)(iVar1 - iVar15) << 4);
    pVVar2->nCap = iVar1;
  }
  pVVar2->nSize = iVar1;
  pVVar8 = p->vSolCur;
  if (pVVar8->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vSolCur) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x10c,"void Sbl_ManGetCurrentMapping(Sbl_Man_t *)");
  }
  lVar10 = 0;
  while( true ) {
    iVar1 = pVVar8->pArray[lVar10];
    lVar9 = (long)iVar1;
    if ((((lVar9 < 0) || (p->vCutsI1->nSize <= iVar1)) || (p->vCutsI2->nSize <= iVar1)) ||
       ((p->vCutsN1->nSize <= iVar1 || (p->vCutsN2->nSize <= iVar1)))) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if (p->vCutsObj->nSize <= iVar1) break;
    iVar1 = p->vCutsObj->pArray[lVar9];
    lVar12 = (long)iVar1;
    if ((lVar12 < 0) || (p->vWindow->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    uVar13 = p->vCutsI1->pArray[lVar9];
    uVar3 = p->vCutsI2->pArray[lVar9];
    uVar4 = p->vCutsN1->pArray[lVar9];
    uVar5 = p->vCutsN2->pArray[lVar9];
    pVVar6 = p->vWindow->pArray;
    pVVar8 = pVVar6 + lVar12;
    pVVar6[lVar12].nSize = 0;
    uVar11 = 0;
    do {
      if ((uVar13 >> (uVar11 & 0x3f) & 1) != 0) {
        if ((long)p->vLeaves->nSize <= (long)uVar11) goto LAB_00753402;
        Vec_IntPush(pVVar8,p->vLeaves->pArray[uVar11]);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x40);
    uVar13 = 0;
    do {
      if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
        if ((long)p->vLeaves->nSize <= (long)(uVar13 + 0x40)) goto LAB_00753402;
        Vec_IntPush(pVVar8,p->vLeaves->pArray[uVar13 + 0x40]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x40);
    uVar13 = 0;
    do {
      if ((uVar4 >> (uVar13 & 0x3f) & 1) != 0) {
        if ((long)p->vAnds->nSize <= (long)uVar13) goto LAB_00753402;
        Vec_IntPush(pVVar8,p->vAnds->pArray[uVar13]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x40);
    uVar13 = 0;
    do {
      if ((uVar5 >> (uVar13 & 0x3f) & 1) != 0) {
        if ((long)p->vAnds->nSize <= (long)(uVar13 + 0x40)) goto LAB_00753402;
        Vec_IntPush(pVVar8,p->vAnds->pArray[uVar13 + 0x40]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x40);
    lVar10 = lVar10 + 1;
    pVVar8 = p->vSolCur;
    if (pVVar8->nSize <= lVar10) {
      return;
    }
  }
LAB_00753402:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbl_ManGetCurrentMapping( Sbl_Man_t * p )
{
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj;
    Vec_WecClear( p->vWindow );
    Vec_WecInit( p->vWindow, Vec_IntSize(p->vAnds) );
    assert( Vec_IntSize(p->vSolCur) > 0 );
    Vec_IntForEachEntry( p->vSolCur, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj  = Vec_IntEntry( p->vCutsObj, c );
        //iObj  = Vec_IntEntry( p->vAnds, iObj );
        vObj  = Vec_WecEntry( p->vWindow, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
    }
}